

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_reader.hpp
# Opt level: O3

CmdValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
* __thiscall
CmdValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
::operator>>(CmdValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *val)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  char **ppcVar4;
  char *s;
  long lVar5;
  long lVar6;
  char cVar7;
  cpp_dec_float<100U,_int,_void> local_68;
  
  iVar2 = this->argc;
  iVar3 = *(int *)&(this->
                   super_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   ).field_0xc;
  lVar5 = (long)iVar3;
  if (iVar3 < iVar2) {
    ppcVar4 = this->argv;
    do {
      s = ppcVar4[lVar5];
      cVar7 = *s;
      if (cVar7 == '\0') {
LAB_0011030c:
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 0x10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems[6] = 0;
        local_68.data._M_elems[7] = 0;
        local_68.data._M_elems[8] = 0;
        local_68.data._M_elems[9] = 0;
        local_68.data._M_elems[10] = 0;
        local_68.data._M_elems[0xb] = 0;
        local_68.data._M_elems[0xc] = 0;
        local_68.data._M_elems[0xd] = 0;
        local_68.data._M_elems._56_5_ = 0;
        local_68.data._M_elems[0xf]._1_3_ = 0;
        local_68.exp = 0;
        local_68.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string(&local_68,s);
        *(undefined8 *)(val->m_backend).data._M_elems = local_68.data._M_elems._0_8_;
        *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_68.data._M_elems._8_8_;
        *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_68.data._M_elems._16_8_;
        *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_68.data._M_elems._24_8_;
        *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_68.data._M_elems._32_8_;
        *(undefined8 *)((val->m_backend).data._M_elems + 10) = local_68.data._M_elems._40_8_;
        *(undefined8 *)((val->m_backend).data._M_elems + 0xc) = local_68.data._M_elems._48_8_;
        *(ulong *)((val->m_backend).data._M_elems + 0xe) =
             CONCAT35(local_68.data._M_elems[0xf]._1_3_,local_68.data._M_elems._56_5_);
        (val->m_backend).exp = local_68.exp;
        (val->m_backend).neg = local_68.neg;
        (val->m_backend).fpclass = local_68.fpclass;
        (val->m_backend).prec_elem = local_68.prec_elem;
        puVar1 = &(this->
                  super_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  ).field_0xc;
        *(int *)puVar1 = *(int *)puVar1 + 1;
        return this;
      }
      lVar6 = 0;
      while (((int)cVar7 - 0x30U < 10 || ((cVar7 == '-' && (lVar6 == 0))))) {
        cVar7 = s[lVar6 + 1];
        lVar6 = lVar6 + 1;
        if (cVar7 == '\0') goto LAB_0011030c;
      }
      lVar5 = lVar5 + 1;
      *(int *)&(this->
               super_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               ).field_0xc = (int)lVar5;
    } while (iVar2 != (int)lVar5);
  }
  (this->
  super_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ).finished = true;
  return this;
}

Assistant:

CmdValueReader &operator>>(ValueType &val) override {
        while (pos < argc) {
            if (!IsInteger(argv[pos])) {
                ++pos;
                continue;
            }
            val = ReadInteger<ValueType>(argv[pos]);
            ++pos;
            return *this;
        }
        this->finished = true;
        return *this;
    }